

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O1

void __thiscall mario::TcpClient::removeConnection(TcpClient *this,TcpConnectionPtr *conn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *this_00;
  element_type *peVar2;
  Writer *pWVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  TcpClient *local_c0;
  string local_b8;
  undefined1 local_98 [16];
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  LineNumber local_78;
  char *local_70;
  VerboseLevel local_68;
  Logger *local_60;
  bool local_58;
  Logger *local_50;
  char *local_48;
  DispatchAction local_40;
  pointer local_38;
  pointer pbStack_30;
  pointer local_28;
  
  EventLoop::assertInLoopThread(this->_loop);
  pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  p_Var1 = (this->_connection).super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->_connection).super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_connection).super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  this_00 = this->_loop;
  peVar2 = (conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_88 = (_Manager_type)0x0;
  p_Stack_80 = (_Invoker_type)0x0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._0_8_ = operator_new(0x20);
  *(code **)local_98._0_8_ = TcpConnection::connectDestroyed;
  *(undefined8 *)(local_98._0_8_ + 8) = 0;
  *(element_type **)(local_98._0_8_ + 0x10) = peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98._0_8_ + 0x18) = p_Var1;
  p_Stack_80 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>_>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>_>
             ::_M_manager;
  EventLoop::queueInLoop(this_00,(Functor *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if ((this->_retry == true) && (this->_connect == true)) {
    local_98._0_8_ = &PTR__Writer_00133a10;
    local_98._8_8_ = 0;
    local_88 = (_Manager_type)CONCAT44(local_88._4_4_,0x80);
    p_Stack_80 = (_Invoker_type)0x124478;
    local_78 = 0x76;
    local_70 = "void mario::TcpClient::removeConnection(const TcpConnectionPtr &)";
    local_68 = 0;
    local_60 = (Logger *)0x0;
    local_58 = false;
    local_50 = (Logger *)0x0;
    local_48 = "";
    local_40 = NormalLog;
    local_38 = (pointer)0x0;
    pbStack_30 = (pointer)0x0;
    local_28 = (pointer)0x0;
    pWVar3 = el::base::Writer::construct((Writer *)local_98,1,"default");
    if (pWVar3->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"TcpClient::connect [");
    }
    local_c0 = this;
    if (pWVar3->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,&local_c0);
    }
    if (pWVar3->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"] - Reconnecting to ");
    }
    InetAddress::toHostPort_abi_cxx11_
              (&local_b8,
               &((this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_serverAddr);
    if (pWVar3->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    el::base::Writer::~Writer((Writer *)local_98);
    Connector::restart((this->_connector).
                       super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void TcpClient::removeConnection(const TcpConnectionPtr& conn) {
    _loop->assertInLoopThread();
    {
        MutexLockGuard lock(_mutex);
        _connection.reset();
    }
    _loop->queueInLoop(
            std::bind(&TcpConnection::connectDestroyed, conn)
            );
    if (_retry && _connect) {
        LOG(INFO) << "TcpClient::connect [" << this << "] - Reconnecting to "
            << _connector->serverAddress().toHostPort();
        _connector->restart();
    }
}